

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canLz4(void)

{
  wchar_t wVar1;
  
  if (canLz4::tested == L'\0') {
    canLz4::tested = L'\x01';
    wVar1 = systemf("lz4 --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canLz4::value = L'\x01';
    }
  }
  return canLz4::value;
}

Assistant:

int
canLz4(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lz4 --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}